

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KirkwoodBuff.cpp
# Opt level: O1

void __thiscall OpenMD::KirkwoodBuff::processHistograms(KirkwoodBuff *this)

{
  pointer pvVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  RealType RVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  vector<int,_std::allocator<int>_> nPairs;
  vector<int,_std::allocator<int>_> local_70;
  undefined8 local_58;
  RealType RStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  
  std::vector<int,_std::allocator<int>_>::vector(&local_70,&(this->super_MultiComponentRDF).nPairs_)
  ;
  RVar5 = Snapshot::getVolume(((this->super_MultiComponentRDF).super_StaticAnalyser.info_)->sman_->
                              currentSnapshot_);
  this->meanVol_ = this->meanVol_ + RVar5;
  if ((this->histograms_).
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->histograms_).
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar4 = 0;
    local_58 = 0x4008000000000000;
    RStack_50 = RVar5;
    do {
      pvVar1 = (this->histograms_).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar1[uVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data + 8) !=
          pvVar1[uVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar3 = 0;
        do {
          auVar7._8_4_ = (int)(uVar3 >> 0x20);
          auVar7._0_8_ = uVar3;
          auVar7._12_4_ = 0x45300000;
          dStack_40 = auVar7._8_8_ - 1.9342813113834067e+25;
          local_48 = (dStack_40 + ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) *
                     this->deltaR_;
          local_38 = pow(this->deltaR_ + local_48,3.0);
          dVar6 = pow(local_48,3.0);
          auVar9._8_8_ = RStack_50;
          auVar9._0_8_ = local_58;
          auVar8._0_8_ = (local_38 - dVar6) * 12.566370614359172;
          auVar8._8_8_ = (double)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar4];
          auVar9 = divpd(auVar8,auVar9);
          lVar2 = *(long *)&(this->gofrs_).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar4].
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data;
          *(double *)(lVar2 + uVar3 * 8) =
               (double)*(int *)(*(long *)&(this->histograms_).
                                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar4].
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data + uVar3 * 4) /
               (auVar9._8_8_ * auVar9._0_8_) + *(double *)(lVar2 + uVar3 * 8);
          uVar3 = uVar3 + 1;
          pvVar1 = (this->histograms_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar3 < (ulong)((long)*(pointer *)
                                        ((long)&pvVar1[uVar4].
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data + 8) -
                                 *(long *)&pvVar1[uVar4].
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data >> 2));
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)(((long)(this->histograms_).
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->histograms_).
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void KirkwoodBuff::processHistograms() {
    std::vector<int> nPairs = getNPairs();
    RealType volume =
        info_->getSnapshotManager()->getCurrentSnapshot()->getVolume();

    meanVol_ += volume;

    for (std::size_t i {}; i < histograms_.size(); ++i) {
      for (std::size_t j {}; j < histograms_[i].size(); ++j) {
        RealType rLower   = j * deltaR_;
        RealType rUpper   = rLower + deltaR_;
        RealType volSlice = 4.0 * Constants::PI *
                            (std::pow(rUpper, 3) - std::pow(rLower, 3)) / 3.0;
        RealType pairDensity = nPairs[i] / volume;
        RealType nIdeal      = volSlice * pairDensity;

        gofrs_[i][j] += histograms_[i][j] / nIdeal;
      }
    }
  }